

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O1

int mbedtls_ecdh_make_params
              (mbedtls_ecdh_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t grp_len;
  size_t pt_len;
  size_t local_38;
  size_t local_30;
  
  iVar1 = -0x4f80;
  if ((ctx != (mbedtls_ecdh_context *)0x0) && ((ctx->grp).pbits != 0)) {
    iVar1 = mbedtls_ecp_gen_keypair(&ctx->grp,&ctx->d,&ctx->Q,f_rng,p_rng);
    if ((iVar1 == 0) &&
       ((iVar1 = mbedtls_ecp_tls_write_group(&ctx->grp,&local_38,buf,blen), iVar1 == 0 &&
        (iVar1 = mbedtls_ecp_tls_write_point
                           (&ctx->grp,&ctx->Q,ctx->point_format,&local_30,buf + local_38,
                            blen - local_38), iVar1 == 0)))) {
      *olen = local_30 + local_38;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdh_make_params( mbedtls_ecdh_context *ctx, size_t *olen,
                      unsigned char *buf, size_t blen,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    int ret;
    size_t grp_len, pt_len;

    if( ctx == NULL || ctx->grp.pbits == 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecdh_gen_public( &ctx->grp, &ctx->d, &ctx->Q, f_rng, p_rng ) )
                != 0 )
        return( ret );

    if( ( ret = mbedtls_ecp_tls_write_group( &ctx->grp, &grp_len, buf, blen ) )
                != 0 )
        return( ret );

    buf += grp_len;
    blen -= grp_len;

    if( ( ret = mbedtls_ecp_tls_write_point( &ctx->grp, &ctx->Q, ctx->point_format,
                                     &pt_len, buf, blen ) ) != 0 )
        return( ret );

    *olen = grp_len + pt_len;
    return( 0 );
}